

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O2

void __thiscall Flic::readLc(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ushort local_36;
  short local_34;
  byte local_32;
  char local_31 [3];
  uint16_t lines;
  int16_t lineSkip;
  uint8_t pixelSkip;
  char count;
  ulong __n;
  
  uVar10 = (uint)(header->depth >> 3);
  __n = (ulong)uVar10;
  memcpy(frame->pixels,
         (this->frames_).super__Vector_base<FlicFrame,_std::allocator<FlicFrame>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].pixels,
         (ulong)((uint)header->height * (uint)header->width * uVar10));
  std::istream::read((char *)is,(long)&local_36);
  uVar3 = 0;
  iVar6 = 0;
  while (iVar6 < (int)(uint)local_36) {
    std::istream::read((char *)is,(long)&local_34);
    iVar5 = (int)local_34;
    if (local_34 < 0) {
      uVar3 = uVar3 - iVar5;
    }
    else {
      iVar8 = 0;
      for (iVar1 = 0; iVar1 != iVar5; iVar1 = iVar1 + 1) {
        std::istream::read((char *)is,(long)&local_32);
        uVar2 = (uint)local_32;
        iVar7 = (uint)header->width * ((uint)header->height + ~uVar3) + iVar8 + uVar2;
        std::istream::read((char *)is,(long)local_31);
        if (local_31[0] < '\0') {
          pvVar4 = operator_new__(__n);
          std::istream::read((char *)is,(long)pvVar4);
          lVar9 = (long)(int)(iVar7 * uVar10);
          for (lVar11 = 0; iVar7 = (int)local_31[0],
              SBORROW8(lVar11,-(long)iVar7) != lVar11 + iVar7 < 0; lVar11 = lVar11 + 1) {
            memcpy(frame->pixels + lVar9,pvVar4,__n);
            lVar9 = lVar9 + __n;
          }
          iVar7 = -iVar7;
          operator_delete(pvVar4);
        }
        else {
          lVar11 = (long)(int)(iVar7 * uVar10);
          for (lVar9 = 0; lVar9 < local_31[0]; lVar9 = lVar9 + 1) {
            pvVar4 = operator_new__(__n);
            std::istream::read((char *)is,(long)pvVar4);
            memcpy(frame->pixels + lVar11,pvVar4,__n);
            operator_delete(pvVar4);
            lVar11 = lVar11 + __n;
          }
          iVar7 = (int)local_31[0];
        }
        iVar8 = iVar8 + uVar2 + iVar7;
      }
      uVar3 = uVar3 + 1;
      iVar6 = iVar6 + 1;
    }
  }
  return;
}

Assistant:

void Flic::readLc(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	memcpy(frame.pixels, frames_.back().pixels, header.width * header.height * bytespp);
	uint16_t lines;
	is.read((char*)&lines, 2);
	int j = 0, y = 0;
	while (j < lines) {
		int16_t lineSkip;
		is.read(reinterpret_cast<char*>(&lineSkip), 2);
		if (lineSkip < 0) {
			y += -lineSkip;
			continue;
		} else {
			int packets = lineSkip;
			int x = 0;
			for (int k = 0; k < packets; ++k) {
				uint8_t pixelSkip;
				is.read((char*)&pixelSkip, 1);
				x += pixelSkip;
				int offset = ((header.height - y - 1) * header.width + x) * bytespp;
				char count;
				is.read(&count, 1);
				if (count < 0) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					for (int j = 0; j < -count; ++j) {
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					}
					x += -count;
					delete tmp;
				} else {
					for (int j = 0; j < count; ++j) {
						char *tmp = new char[bytespp];
						is.read(tmp, bytespp);
						memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
						delete tmp;
					}
					x += count;
				}
			}
			++y;
		}
		++j;
	}
}